

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

_Bool al_save_sample_f(ALLEGRO_FILE *fp,char *ident,ALLEGRO_SAMPLE *spl)

{
  ACODEC_TABLE *pAVar1;
  ulong uVar2;
  ALLEGRO_SAMPLE *in_RDX;
  char *in_RSI;
  ALLEGRO_FILE *in_RDI;
  ACODEC_TABLE *ent;
  _Bool local_1;
  
  pAVar1 = find_acodec_table_entry(in_RSI);
  if ((pAVar1 == (ACODEC_TABLE *)0x0) ||
     (pAVar1->fs_saver == (_func__Bool_ALLEGRO_FILE_ptr_ALLEGRO_SAMPLE_ptr *)0x0)) {
    uVar2 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x185,"al_save_sample_f");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("No handler for audio file extension %s.\n",in_RSI);
    }
    local_1 = false;
  }
  else {
    local_1 = (*pAVar1->fs_saver)(in_RDI,in_RDX);
  }
  return local_1;
}

Assistant:

bool al_save_sample_f(ALLEGRO_FILE *fp, const char *ident, ALLEGRO_SAMPLE *spl)
{
   ACODEC_TABLE *ent;

   ASSERT(fp);
   ASSERT(ident);
   
   ent = find_acodec_table_entry(ident);
   if (ent && ent->fs_saver) {
      return (ent->fs_saver)(fp, spl);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s.\n", ident);
   }

   return false;
}